

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::CheckALLOW_DUPLICATE_CUSTOM_TARGETS(cmGlobalGenerator *this)

{
  bool bVar1;
  cmState *this_00;
  ostream *poVar2;
  string local_208;
  string local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream e;
  allocator<char> local_39;
  string local_38;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *this_local;
  
  local_18 = this;
  this_00 = cmake::GetState(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ALLOW_DUPLICATE_CUSTOM_TARGETS",&local_39);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar2 = std::operator<<((ostream *)local_1c8,
                             "This project has enabled the ALLOW_DUPLICATE_CUSTOM_TARGETS ");
    poVar2 = std::operator<<(poVar2,"global property.  ");
    poVar2 = std::operator<<(poVar2,"The \"");
    (*this->_vptr_cmGlobalGenerator[3])(local_1e8);
    poVar2 = std::operator<<(poVar2,local_1e8);
    poVar2 = std::operator<<(poVar2,"\" generator does not support ");
    poVar2 = std::operator<<(poVar2,"duplicate custom targets.  ");
    poVar2 = std::operator<<(poVar2,
                             "Consider using a Makefiles generator or fix the project to not ");
    std::operator<<(poVar2,"use duplicate target names.");
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGenerator::CheckALLOW_DUPLICATE_CUSTOM_TARGETS() const
{
  // If the property is not enabled then okay.
  if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
        "ALLOW_DUPLICATE_CUSTOM_TARGETS")) {
    return true;
  }

  // This generator does not support duplicate custom targets.
  std::ostringstream e;
  e << "This project has enabled the ALLOW_DUPLICATE_CUSTOM_TARGETS "
    << "global property.  "
    << "The \"" << this->GetName() << "\" generator does not support "
    << "duplicate custom targets.  "
    << "Consider using a Makefiles generator or fix the project to not "
    << "use duplicate target names.";
  cmSystemTools::Error(e.str());
  return false;
}